

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_channel.cc
# Opt level: O2

vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
* __thiscall
assembler::VirtualChannel::process
          (vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
           *__return_storage_ptr__,VirtualChannel *this,VCDU *vcdu)

{
  unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_> *this_00;
  byte bVar1;
  raw *prVar2;
  byte *pbVar3;
  bool bVar4;
  uint b;
  int iVar5;
  ostream *poVar6;
  TransportPDU *pTVar7;
  ssize_t sVar8;
  uint uVar9;
  VirtualChannel *__nbytes;
  VirtualChannel *pVVar10;
  _Head_base<0UL,_assembler::TransportPDU_*,_false> *this_01;
  short sVar11;
  VirtualChannel *pVVar12;
  ulong uVar13;
  pointer __p;
  _Head_base<0UL,_assembler::TransportPDU_*,_false> local_50;
  _Head_base<0UL,_assembler::TransportPDU_*,_false> local_48;
  _Head_base<0UL,_assembler::TransportPDU_*,_false> local_40;
  __uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_> local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar9 = this->n_;
  if (-1 < (int)uVar9) {
    b = VCDU::getCounter(vcdu);
    iVar5 = diffWithWrap<16777216u>(uVar9,b);
    if (1 < iVar5) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"VC ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->id_);
      poVar6 = std::operator<<(poVar6,": VCDU drop! (lost ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar5 + -1);
      poVar6 = std::operator<<(poVar6,"; prev: ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->n_);
      poVar6 = std::operator<<(poVar6,"; packet: ");
      iVar5 = VCDU::getCounter(vcdu);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar5);
      poVar6 = std::operator<<(poVar6,")");
      std::endl<char,std::char_traits<char>>(poVar6);
      std::__uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>::
      reset((__uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
             *)&this->tpdu_,(pointer)0x0);
    }
  }
  iVar5 = VCDU::getCounter(vcdu);
  this->n_ = iVar5;
  prVar2 = vcdu->data_;
  uVar13 = (ulong)((prVar2->_M_elems[6] & 7) << 8);
  bVar1 = prVar2->_M_elems[7];
  pVVar12 = (VirtualChannel *)(bVar1 | uVar13);
  iVar5 = (int)prVar2 + 8;
  this_00 = &this->tpdu_;
  pTVar7 = (this->tpdu_)._M_t.
           super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
           ._M_t.
           super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
           .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl;
  sVar11 = (short)pVVar12;
  __nbytes = this;
  if (pTVar7 == (TransportPDU *)0x0) goto LAB_0019c2a6;
  pbVar3 = *(byte **)&(pTVar7->header).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
  __nbytes = (VirtualChannel *)
             (*(pointer *)
               ((long)&(pTVar7->header).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_> + 8) +
             -(long)pbVar3);
  if (__nbytes == (VirtualChannel *)0x6) {
    __nbytes = (VirtualChannel *)0x374;
    if ((sVar11 == 0x7ff) ||
       (pVVar10 = (VirtualChannel *)
                  (*(long *)&(pTVar7->data).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data +
                  ((ulong)((uint)pbVar3[4] * 0x100 + (uint)pbVar3[5] + 1 & 0xffff) -
                  (long)*(pointer *)
                         ((long)&(pTVar7->data).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_> +
                         8))), __nbytes = pVVar12, pVVar10 <= pVVar12)) {
      sVar8 = TransportPDU::read(pTVar7,iVar5,(void *)0x374,(size_t)__nbytes);
      bVar4 = TransportPDU::dataComplete
                        ((this_00->_M_t).
                         super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
                         .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl);
      if (bVar4) {
        local_40._M_head_impl =
             (this->tpdu_)._M_t.
             super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
             ._M_t.
             super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
             .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl;
        (this->tpdu_)._M_t.
        super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
        ._M_t.
        super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
        .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl = (TransportPDU *)0x0;
        process(this,(unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                      *)&local_40,__return_storage_ptr__);
        this_01 = &local_40;
        goto LAB_0019c294;
      }
    }
    else {
      if (((sVar11 != 0) || (pVVar10 != (VirtualChannel *)0x6)) ||
         (uVar9 = (*pbVar3 & 7) << 8, __nbytes = (VirtualChannel *)(ulong)uVar9,
         (pbVar3[1] | uVar9) != 0x7ff)) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"VC ");
        __nbytes = this;
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->id_);
        poVar6 = std::operator<<(poVar6,": M_SDU continuation failed; ");
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        poVar6 = std::operator<<(poVar6," byte(s) needed to complete M_SDU, ");
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        poVar6 = std::operator<<(poVar6," byte(s) available");
        std::endl<char,std::char_traits<char>>(poVar6);
      }
      sVar8 = 0;
      std::__uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>::
      reset((__uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
             *)this_00,(pointer)0x0);
    }
  }
  else {
    sVar8 = TransportPDU::read(pTVar7,iVar5,(void *)0x374,(size_t)__nbytes);
    bVar4 = TransportPDU::dataComplete
                      ((this_00->_M_t).
                       super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
                       .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl);
    if (bVar4) {
      local_48._M_head_impl =
           (this->tpdu_)._M_t.
           super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
           ._M_t.
           super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
           .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl;
      (this->tpdu_)._M_t.
      super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>.
      _M_t.
      super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
      .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl = (TransportPDU *)0x0;
      process(this,(unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                    *)&local_48,__return_storage_ptr__);
      this_01 = &local_48;
LAB_0019c294:
      std::unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>::
      ~unique_ptr((unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                   *)this_01);
    }
  }
  if (sVar8 == 0x374) {
    return __return_storage_ptr__;
  }
LAB_0019c2a6:
  if (sVar11 != 0x7ff) {
    uVar13 = bVar1 | uVar13;
    while (uVar13 < 0x374) {
      pTVar7 = (TransportPDU *)operator_new(0x30);
      TransportPDU::TransportPDU(pTVar7);
      local_38._M_t.
      super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
      .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl =
           (tuple<assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>)
           (_Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
            )0x0;
      std::__uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>::
      reset((__uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
             *)this_00,pTVar7);
      std::unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>::
      ~unique_ptr((unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                   *)&local_38);
      sVar8 = TransportPDU::read((this_00->_M_t).
                                 super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
                                 .super__Head_base<0UL,_assembler::TransportPDU_*,_false>.
                                 _M_head_impl,iVar5 + (int)uVar13,(void *)(0x374 - uVar13),
                                 (size_t)__nbytes);
      uVar13 = uVar13 + sVar8;
      bVar4 = TransportPDU::dataComplete
                        ((this_00->_M_t).
                         super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
                         .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl);
      if (bVar4) {
        local_50._M_head_impl =
             (this->tpdu_)._M_t.
             super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
             ._M_t.
             super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
             .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl;
        (this->tpdu_)._M_t.
        super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
        ._M_t.
        super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
        .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl = (TransportPDU *)0x0;
        process(this,(unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                      *)&local_50,__return_storage_ptr__);
        std::unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>::
        ~unique_ptr((unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                     *)&local_50);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::unique_ptr<SessionPDU>> VirtualChannel::process(const VCDU& vcdu) {
  std::vector<std::unique_ptr<SessionPDU>> out;
  uint16_t firstHeader;
  size_t pos;

  // Sanity check on VCDU counter (wraps at 2^24)
  if (n_ >= 0) {
    auto skip = diffWithWrap<(1 << 24)>(n_, vcdu.getCounter());

    // Abort processing of pending TP_PDU in case of drop.
    if (skip > 1) {
      std::cerr
        <<  "VC " << id_
        << ": VCDU drop! (lost " << (skip - 1)
        << "; prev: " << n_
        << "; packet: " << vcdu.getCounter()
        << ")"
        << std::endl;
      tpdu_.reset();
    }
  }

  // Update counter with current VCDU
  n_ = vcdu.getCounter();

  // Get iterators to begin/end of the VCDU Data Unit
  auto data = vcdu.data();
  auto len = vcdu.len();

  // Extract "first header pointer" field from M_PDU header
  firstHeader = ((data[0] & 0x7) << 8) | data[1];

  // Skip over M_PDU header
  data += 2;
  len -= 2;

  // Resume extracting a packet if we still have a pointer
  pos = 0;
  if (tpdu_) {
    // Double check that the number of bytes left to read correspond
    // with the first header pointer. The latter takes precedence.
    if (tpdu_->headerComplete()) {
      auto bytesNeeded = tpdu_->length() - tpdu_->data.size();
      // If the first header pointer is 2047, there is no additional
      // header in the VCDU and we can read the entire thing.
      auto bytesAvailable = (firstHeader == 2047) ? len : firstHeader;
      if (firstHeader != 2047 && bytesAvailable < bytesNeeded) {
        // Don't log error message for fill packets.
        // On the GOES-16 HRIT feed these can expect 6 more bytes
        // if they are aligned on the VCDU boundary. I suspect this
        // number comes from the the 6 header bytes in a VCDU and
        // that this is a mistake in the HRIT feed assembly code.
        if (!(bytesAvailable == 0 && bytesNeeded == 6 && tpdu_->apid() == 2047)) {
          std::cerr
            <<  "VC " << id_
            << ": M_SDU continuation failed; "
            << bytesNeeded << " byte(s) needed to complete M_SDU, "
            << bytesAvailable << " byte(s) available"
            << std::endl;
        }
        tpdu_.reset();
      } else {
        pos += tpdu_->read(&data[pos], len - pos);
        if (tpdu_->dataComplete()) {
          process(std::move(tpdu_), out);
        }
      }
    } else {
      pos += tpdu_->read(&data[pos], len - pos);
      if (tpdu_->dataComplete()) {
        process(std::move(tpdu_), out);
      }
    }

    // Return early if we consumed all bytes
    if (pos == len) {
      return out;
    }
  }

  // Must have pointer to first header to continue
  if (firstHeader == 2047) {
    return out;
  }

  // Extract TP_PDUs until there is no more data
  pos = firstHeader;
  while (pos < len) {
    tpdu_ = std::unique_ptr<TransportPDU>(new TransportPDU);
    pos += tpdu_->read(&data[pos], len - pos);
    if (tpdu_->dataComplete()) {
      process(std::move(tpdu_), out);
    }
  }

  return out;
}